

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
insert_node_<true,false,true,float_const&>
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Siblings *sib,
          Vertex_handle v,float *filtration_value)

{
  undefined4 in_register_00000014;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>,_bool>
  *ret_val;
  float *in_R8;
  pair<boost::container::vec_iterator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>,_bool>
  pVar1;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>,_bool>
  pVar2;
  undefined4 local_3c;
  long local_38;
  int local_30 [2];
  __buckets_ptr local_28;
  char local_20;
  
  local_38 = CONCAT44(in_register_00000014,v);
  local_3c = SUB84(filtration_value,0);
  local_30[0] = 0;
  local_30[1] = 0;
  pVar1 = boost::container::dtl::
          flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>>
          ::
          try_emplace<int_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>,std::less<int>,void>>*&,float_const&>
                    ((flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>>
                      *)&local_28,(const_iterator *)(local_38 + 0x10),local_30,
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
                      **)&local_3c,(float *)&local_38);
  pVar2._8_8_ = pVar1._8_8_;
  (this->nodes_label_to_list_)._M_h._M_buckets = local_28;
  *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_20;
  if (local_20 == '\0') {
    if (*(float *)(local_28 + 1) <= *in_R8) {
      (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    }
    else {
      *(float *)(local_28 + 1) = *in_R8;
    }
  }
  pVar2.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)this;
  return pVar2;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }